

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePicker::setDateTimeRange(DateTimePicker *this,QDateTime *min,QDateTime *max)

{
  bool bVar1;
  DateTimePickerPrivate *this_00;
  QDateTime local_30 [8];
  QDateTime maximum;
  QDateTime minimum;
  QDateTime *max_local;
  QDateTime *min_local;
  DateTimePicker *this_local;
  
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  ::operator->(&this->d);
  QDateTime::toTimeSpec((TimeSpec)&maximum);
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  ::operator->(&this->d);
  QDateTime::toTimeSpec((TimeSpec)local_30);
  bVar1 = operator>(min,max);
  if (bVar1) {
    QDateTime::operator=(local_30,&maximum);
  }
  this_00 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
            ::operator->(&this->d);
  DateTimePickerPrivate::setRange(this_00,&maximum,local_30);
  QDateTime::~QDateTime(local_30);
  QDateTime::~QDateTime(&maximum);
  return;
}

Assistant:

void
DateTimePicker::setDateTimeRange( const QDateTime & min, const QDateTime & max )
{
	const QDateTime minimum = min.toTimeSpec( d->spec );
	QDateTime maximum = max.toTimeSpec( d->spec );
	if( min > max )
		maximum = minimum;
	d->setRange( minimum, maximum );
}